

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::iterate(InterCallTestCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  pointer pCVar3;
  TestContext *this_00;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *this_01;
  char cVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar9;
  long lVar10;
  undefined4 extraout_var_02;
  undefined8 uVar11;
  undefined4 extraout_var_03;
  void *__src;
  MessageBuilder *pMVar12;
  TestError *this_02;
  code *pcVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  int *value;
  int programFriendlyName;
  code *local_200;
  allocator<char> local_1f5;
  int resultStorageFriendlyName;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *local_1f0;
  int *local_1e8;
  long local_1e0;
  code *local_1d8;
  vector<int,_std::allocator<int>_> results;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  undefined4 extraout_var_01;
  
  programFriendlyName = 0;
  resultStorageFriendlyName = 0;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"Running operations:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  local_1e8 = &this->m_invocationGridSize;
  local_1f0 = &this->m_storageIDs;
  lVar14 = 0xc;
  lVar16 = 0;
  do {
    pCVar3 = (this->m_cmds).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_cmds).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x14) <= lVar16) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Reading verifier program results");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      uVar11 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      local_1f0 = (map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   *)CONCAT44(local_1f0._4_4_,(int)CONCAT71((int7)((ulong)uVar11 >> 8),1));
      lVar14 = 0;
      local_200 = (code *)((ulong)local_200 & 0xffffffff00000000);
      do {
        if ((int)(((long)(this->m_cmds).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_cmds).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x14) <= lVar14) {
          this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
          if (((ulong)local_1f0 & 1) == 0) {
            pcVar15 = "image";
            if (this->m_storage == STORAGE_BUFFER) {
              pcVar15 = "buffer";
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&results,pcVar15,&local_1f5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &results," content verification failed");
            tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1b0);
            std::__cxx11::string::~string((string *)local_1b0);
            std::__cxx11::string::~string((string *)&results);
          }
          else {
            tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
          }
          return STOP;
        }
        if ((this->m_operationResultStorages).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] != 0) {
          iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          lVar16 = CONCAT44(extraout_var_03,iVar7);
          std::vector<int,_std::allocator<int>_>::vector
                    (&results,(long)(this->m_invocationGridSize * this->m_invocationGridSize),
                     (allocator_type *)local_1b0);
          (**(code **)(lVar16 + 0x40))
                    (0x90d2,(this->m_operationResultStorages).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar14]);
          __src = (void *)(**(code **)(lVar16 + 0xd00))
                                    (0x90d2,0,(long)(*local_1e8 * *local_1e8) << 2,1);
          dVar8 = (**(code **)(lVar16 + 0x800))();
          glu::checkError(dVar8,"map buffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                          ,0x57e);
          memcpy(results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,__src,(long)(*local_1e8 * *local_1e8) << 2);
          cVar4 = (**(code **)(lVar16 + 0x1670))(0x90d2);
          local_1e0 = lVar14;
          if (cVar4 != '\x01') {
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,"memory map store corrupted",&local_1f5);
            tcu::TestError::TestError(this_02,(string *)local_1b0);
            __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          iVar17 = 0;
          lVar14 = 0;
          iVar7 = 0;
          bVar5 = false;
          for (lVar16 = 0;
              lVar16 < (int)((ulong)((long)results.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)results.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2);
              lVar16 = lVar16 + 1) {
            if (*(int *)((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar14) != 1) {
              if (iVar7 == 0) {
                local_1b0 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::operator<<(&local_1a8,"Result storage #");
                iVar7 = (int)local_200 + 1;
                local_200 = (code *)CONCAT44(local_200._4_4_,iVar7);
                std::ostream::operator<<((ostringstream *)&local_1a8,iVar7);
                std::operator<<(&local_1a8," failed, got unexpected values.\n");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                iVar7 = 1;
              }
              else {
                if (4 < iVar7) {
                  local_1b0 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::operator<<(&local_1a8,"\t-- too many errors, skipping verification --\n");
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                  local_1f0 = (map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                               *)((ulong)local_1f0 & 0xffffffff00000000);
                  goto LAB_012881c6;
                }
                iVar7 = iVar7 + 1;
              }
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::operator<<(&local_1a8,"\tError at index ");
              std::ostream::operator<<((ostringstream *)&local_1a8,iVar17);
              std::operator<<(&local_1a8,": expected 1, got ");
              pMVar12 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (int *)((long)results.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar14))
              ;
              std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ".\n");
              tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              bVar5 = true;
            }
            lVar14 = lVar14 + 4;
            iVar17 = iVar17 + 1;
          }
          if (bVar5) {
            local_1f0 = (map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                         *)((ulong)local_1f0 & 0xffffffff00000000);
          }
          else {
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::operator<<(&local_1a8,"Result storage #");
            iVar7 = (int)local_200 + 1;
            local_200 = (code *)CONCAT44(local_200._4_4_,iVar7);
            std::ostream::operator<<((ostringstream *)&local_1a8,iVar7);
            std::operator<<(&local_1a8," ok.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          }
LAB_012881c6:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&results.super__Vector_base<int,_std::allocator<int>_>);
          lVar14 = local_1e0;
        }
        lVar14 = lVar14 + 1;
      } while( true );
    }
    uVar2 = *(uint *)((long)pCVar3 + lVar14 + -0xc);
    if (6 < uVar2) goto LAB_01287e4e;
    pcVar13 = (code *)((long)pCVar3 + lVar14 + -8);
    switch(uVar2) {
    case 0:
      local_200 = pcVar13;
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar10 = CONCAT44(extraout_var_01,iVar7);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Running program #");
      programFriendlyName = programFriendlyName + 1;
      std::ostream::operator<<((ostringstream *)&local_1a8,programFriendlyName);
      std::operator<<(&local_1a8," to write ");
      pcVar15 = "image";
      if (this->m_storage == STORAGE_BUFFER) {
        pcVar15 = "buffer";
      }
      std::operator<<(&local_1a8,pcVar15);
      std::operator<<(&local_1a8," #");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)local_200);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".\n");
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tDispatch size: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e8);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e8);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      (**(code **)(lVar10 + 0x1680))
                (((this->m_operationPrograms).
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar16]->m_program).m_program);
      if (this->m_storage == STORAGE_IMAGE) {
        pcVar13 = *(code **)(lVar10 + 0x80);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](local_1f0,(key_type_conflict *)local_200);
        uVar6 = 0x822e;
        if (this->m_formatInteger != false) {
          uVar6 = 0x8235;
        }
        (*pcVar13)(0,*pmVar9,0,0,0,this->m_useAtomic + 0x88b9,uVar6);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        pcVar15 = "bind destination image";
        iVar7 = 0x5c2;
LAB_01287c21:
        glu::checkError(dVar8,pcVar15,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                        ,iVar7);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        pcVar13 = *(code **)(lVar10 + 0x48);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](local_1f0,(key_type_conflict *)local_200);
        (*pcVar13)(0x90d2,0,*pmVar9);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        pcVar15 = "bind destination buffer";
        iVar7 = 0x5bb;
        goto LAB_01287c21;
      }
      (**(code **)(lVar10 + 0x528))(*local_1e8,*local_1e8,1);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      pcVar15 = "dispatch write";
      iVar7 = 0x5c9;
      break;
    default:
      runSingleRead(this,*(int *)((long)pCVar3 + lVar14 + -8),(int)lVar16,&programFriendlyName,
                    &resultStorageFriendlyName);
      goto LAB_01287e4e;
    case 2:
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      if (this->m_storage == STORAGE_IMAGE) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Memory Barrier\n\tbits = GL_SHADER_IMAGE_ACCESS_BARRIER_BIT");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        uVar11 = 0x20;
      }
      else {
        if (this->m_storage != STORAGE_BUFFER) goto LAB_01287e4e;
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Memory Barrier\n\tbits = GL_SHADER_STORAGE_BARRIER_BIT");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        uVar11 = 0x2000;
      }
      (**(code **)(CONCAT44(extraout_var_02,iVar7) + 0xdb8))(uVar11);
      goto LAB_01287e4e;
    case 3:
      local_200 = pcVar13;
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_1e0 = CONCAT44(extraout_var,iVar7);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Running program #");
      programFriendlyName = programFriendlyName + 1;
      std::ostream::operator<<((ostringstream *)&local_1a8,programFriendlyName);
      std::operator<<(&local_1a8," to verify ");
      pcVar15 = "images";
      if (this->m_storage == STORAGE_BUFFER) {
        pcVar15 = "buffers";
      }
      std::operator<<(&local_1a8,pcVar15);
      std::operator<<(&local_1a8," #");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)local_200);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>," and #")
      ;
      value = (int *)((long)&pCVar3->type + lVar14);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,value);
      poVar1 = &pMVar12->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".\n");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tWriting results to result storage #");
      resultStorageFriendlyName = resultStorageFriendlyName + 1;
      std::ostream::operator<<(poVar1,resultStorageFriendlyName);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".\n");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tDispatch size: ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e8);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e8);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      (**(code **)(local_1e0 + 0x1680))
                (((this->m_operationPrograms).
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar16]->m_program).m_program);
      lVar10 = local_1e0;
      this_01 = local_1f0;
      if (this->m_storage == STORAGE_IMAGE) {
        local_1d8 = *(code **)(local_1e0 + 0x80);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](local_1f0,(key_type_conflict *)local_200);
        uVar6 = 0x822e;
        if (this->m_formatInteger != false) {
          uVar6 = 0x8235;
        }
        (*local_1d8)(1,*pmVar9,0,0,0,(uint)this->m_useAtomic * 2 | 35000,uVar6);
        pcVar13 = *(code **)(lVar10 + 0x80);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](this_01,value);
        uVar6 = 0x822e;
        if (this->m_formatInteger != false) {
          uVar6 = 0x8235;
        }
        (*pcVar13)(2,*pmVar9,0,0,0,(uint)this->m_useAtomic * 2 | 35000,uVar6);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        pcVar15 = "bind source images";
        iVar7 = 0x603;
LAB_01287d36:
        glu::checkError(dVar8,pcVar15,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                        ,iVar7);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        local_1d8 = *(code **)(local_1e0 + 0x48);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](local_1f0,(key_type_conflict *)local_200);
        (*local_1d8)(0x90d2,1,*pmVar9);
        local_200 = *(code **)(lVar10 + 0x48);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](this_01,value);
        (*local_200)(0x90d2,2,*pmVar9);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        pcVar15 = "bind source buffers";
        iVar7 = 0x5fa;
        goto LAB_01287d36;
      }
      (**(code **)(lVar10 + 0x48))
                (0x90d2,0,(this->m_operationResultStorages).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar16]);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"bind result buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0x60b);
      (**(code **)(lVar10 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      pcVar15 = "dispatch read multi";
      iVar7 = 0x60f;
      break;
    case 4:
      local_200 = pcVar13;
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_1e0 = CONCAT44(extraout_var_00,iVar7);
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Running program #");
      programFriendlyName = programFriendlyName + 1;
      std::ostream::operator<<((ostringstream *)&local_1a8,programFriendlyName);
      std::operator<<(&local_1a8," to write ");
      pcVar15 = "image";
      if (this->m_storage == STORAGE_BUFFER) {
        pcVar15 = "buffer";
      }
      std::operator<<(&local_1a8,pcVar15);
      std::operator<<(&local_1a8," #");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)local_200);
      poVar1 = &pMVar12->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".\n");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tWriting to every ");
      pcVar15 = "odd";
      if (*(char *)((long)&pCVar3->type + lVar14) != '\0') {
        pcVar15 = "even";
      }
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar15);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," ");
      pcVar15 = "column";
      if (this->m_storage == STORAGE_BUFFER) {
        pcVar15 = "element";
      }
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar15);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".\n");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tDispatch size: ");
      std::ostream::operator<<(poVar1,*local_1e8 / 2);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"x");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e8);
      std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      lVar10 = local_1e0;
      (**(code **)(local_1e0 + 0x1680))
                (((this->m_operationPrograms).
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar16]->m_program).m_program);
      if (this->m_storage == STORAGE_IMAGE) {
        pcVar13 = *(code **)(lVar10 + 0x80);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](local_1f0,(key_type_conflict *)local_200);
        uVar6 = 0x822e;
        if (this->m_formatInteger != false) {
          uVar6 = 0x8235;
        }
        (*pcVar13)(0,*pmVar9,0,0,0,this->m_useAtomic + 0x88b9,uVar6);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        pcVar15 = "bind destination image";
        iVar7 = 0x62c;
LAB_01287e11:
        glu::checkError(dVar8,pcVar15,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                        ,iVar7);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        pcVar13 = *(code **)(lVar10 + 0x48);
        pmVar9 = std::
                 map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 ::operator[](local_1f0,(key_type_conflict *)local_200);
        (*pcVar13)(0x90d2,0,*pmVar9);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        pcVar15 = "bind destination buffer";
        iVar7 = 0x625;
        goto LAB_01287e11;
      }
      (**(code **)(lVar10 + 0x528))((long)*local_1e8 / 2 & 0xffffffff,*local_1e8,1);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      pcVar15 = "dispatch write";
      iVar7 = 0x633;
    }
    glu::checkError(dVar8,pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,iVar7);
LAB_01287e4e:
    lVar16 = lVar16 + 1;
    lVar14 = lVar14 + 0x14;
  } while( true );
}

Assistant:

InterCallTestCase::IterateResult InterCallTestCase::iterate (void)
{
	int programFriendlyName			= 0;
	int resultStorageFriendlyName	= 0;

	m_testCtx.getLog() << tcu::TestLog::Message << "Running operations:" << tcu::TestLog::EndMessage;

	// run steps

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:				runCommand(m_cmds[step].u_cmd.write,			step,	programFriendlyName);								break;
			case InterCallOperations::Command::TYPE_READ:				runCommand(m_cmds[step].u_cmd.read,				step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_BARRIER:			runCommand(m_cmds[step].u_cmd.barrier);																		break;
			case InterCallOperations::Command::TYPE_READ_MULTIPLE:		runCommand(m_cmds[step].u_cmd.readMulti,		step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:	runCommand(m_cmds[step].u_cmd.writeInterleave,	step,	programFriendlyName);								break;
			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:	runCommand(m_cmds[step].u_cmd.readInterleave,	step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_READ_ZERO:			runCommand(m_cmds[step].u_cmd.readZero,			step,	programFriendlyName, resultStorageFriendlyName);	break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	// read results from result buffers
	if (verifyResults())
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, (std::string((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) + " content verification failed").c_str());

	return STOP;
}